

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GeometryBoxShadow.cpp
# Opt level: O1

void __thiscall
Rml::GeometryBoxShadow::Generate
          (GeometryBoxShadow *this,Geometry *out_shadow_geometry,CallbackTexture *out_shadow_texture
          ,RenderManager *render_manager,Element *element,Geometry *background_border_geometry,
          BoxShadowList *shadow_list,CornerSizes border_radius,float opacity)

{
  float fVar1;
  RenderManager *pRVar2;
  Vector2Type VVar3;
  Vector2Type VVar4;
  Vector2f VVar5;
  Vector2f dimensions;
  Vector2f b;
  Vector2f b_00;
  Vector2f b_01;
  Vector2f origin;
  Vector2f a;
  StableVectorIndex SVar6;
  undefined1 auVar7 [8];
  Mesh *mesh_00;
  int iVar8;
  int iVar9;
  BoxShadowList *__range1;
  Vector2Type VVar10;
  BoxShadow *shadow;
  RenderManager *pRVar11;
  float fVar12;
  undefined4 in_XMM0_Dc;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 in_XMM0_Dd;
  undefined4 extraout_XMM0_Dd;
  undefined4 extraout_XMM0_Dd_00;
  undefined4 in_XMM1_Dc;
  undefined4 in_XMM1_Dd;
  float fVar13;
  uint uVar14;
  undefined4 uVar15;
  float fVar16;
  Mesh mesh;
  undefined1 local_128 [8];
  Vector2f VStack_120;
  float local_10c;
  float local_108;
  float fStack_104;
  undefined8 uStack_100;
  undefined1 local_f8 [8];
  uint uStack_f0;
  undefined4 uStack_ec;
  float local_e8;
  float fStack_e4;
  undefined4 uStack_e0;
  undefined4 uStack_dc;
  Vector2Type local_d0;
  Vector2Type local_c8;
  Mesh *local_c0;
  undefined1 local_b8 [24];
  pointer local_a0;
  pointer local_90;
  Vector2Type *local_88;
  undefined8 uStack_80;
  code *local_78;
  code *pcStack_70;
  undefined1 local_68 [16];
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_58._8_4_ = in_XMM1_Dc;
  local_58._0_8_ = border_radius._M_elems._8_8_;
  local_58._12_4_ = in_XMM1_Dd;
  local_68._8_4_ = in_XMM0_Dc;
  local_68._0_8_ = border_radius._M_elems._0_8_;
  local_68._12_4_ = in_XMM0_Dd;
  pRVar2 = *(RenderManager **)
            &(background_border_geometry->
             super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
             ).resource_handle;
  local_d0 = (Vector2Type)out_shadow_geometry;
  local_c0 = (Mesh *)out_shadow_texture;
  local_c8 = (Vector2Type)element;
  local_10c = opacity;
  for (pRVar11 = (background_border_geometry->
                 super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                 ).render_manager; pRVar11 != pRVar2;
      pRVar11 = (RenderManager *)
                ((long)&(pRVar11->geometry_list).free_slots.
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                + 8)) {
    fVar12 = Element::ResolveLength
                       ((Element *)render_manager,
                        *(NumericValue *)
                         ((long)&(pRVar11->geometry_list).elements.
                                 super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                 ._M_impl.super__Vector_impl_data + 0xc));
    *(float *)((long)&(pRVar11->geometry_list).elements.
                      super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                      ._M_impl.super__Vector_impl_data + 0xc) = fVar12;
    *(undefined4 *)
     ((long)&(pRVar11->geometry_list).elements.
             super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
             ._M_impl.super__Vector_impl_data + 0x10) = 0x40;
    fVar12 = Element::ResolveLength
                       ((Element *)render_manager,
                        *(NumericValue *)
                         ((long)&(pRVar11->geometry_list).elements.
                                 super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                 ._M_impl.super__Vector_impl_data + 0x14));
    *(float *)((long)&(pRVar11->geometry_list).elements.
                      super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                      ._M_impl.super__Vector_impl_data + 0x14) = fVar12;
    *(undefined4 *)
     &(pRVar11->geometry_list).free_slots.super__Bvector_base<std::allocator<bool>_>._M_impl.
      super__Bvector_impl_data._M_start.super__Bit_iterator_base = 0x40;
    fVar12 = Element::ResolveLength
                       ((Element *)render_manager,
                        *(NumericValue *)((long)&pRVar11->render_interface + 4));
    *(float *)((long)&pRVar11->render_interface + 4) = fVar12;
    *(undefined4 *)
     &(pRVar11->geometry_list).elements.
      super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
      ._M_impl.super__Vector_impl_data._M_start = 0x40;
    fVar12 = Element::ResolveLength
                       ((Element *)render_manager,
                        *(NumericValue *)
                         ((long)&(pRVar11->geometry_list).elements.
                                 super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                 ._M_impl.super__Vector_impl_data + 4));
    *(float *)((long)&(pRVar11->geometry_list).elements.
                      super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                      ._M_impl.super__Vector_impl_data + 4) = fVar12;
    *(undefined4 *)
     ((long)&(pRVar11->geometry_list).elements.
             super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
             ._M_impl.super__Vector_impl_data + 8) = 0x40;
  }
  pRVar2 = *(RenderManager **)
            &(background_border_geometry->
             super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
             ).resource_handle;
  local_e8 = 0.0;
  fStack_e4 = 0.0;
  uStack_e0 = 0;
  uStack_dc = 0;
  fVar12 = 0.0;
  fVar13 = 0.0;
  uVar14 = 0;
  uVar15 = 0;
  for (pRVar11 = (background_border_geometry->
                 super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                 ).render_manager; pRVar11 != pRVar2;
      pRVar11 = (RenderManager *)
                ((long)&(pRVar11->geometry_list).free_slots.
                        super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                + 8)) {
    if (*(char *)((long)&(pRVar11->geometry_list).free_slots.
                         super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data
                 + 4) == '\0') {
      fVar16 = *(float *)((long)&(pRVar11->geometry_list).elements.
                                 super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                 ._M_impl.super__Vector_impl_data + 0xc) * 1.5 +
               *(float *)((long)&(pRVar11->geometry_list).elements.
                                 super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                 ._M_impl.super__Vector_impl_data + 0x14);
      local_48 = ZEXT416((uint)fVar16);
      fVar1 = *(float *)((long)&pRVar11->render_interface + 4);
      local_108 = *(float *)((long)&(pRVar11->geometry_list).elements.
                                    super__Vector_base<Rml::RenderManager::GeometryData,_std::allocator<Rml::RenderManager::GeometryData>_>
                                    ._M_impl.super__Vector_impl_data + 4);
      VVar5.y = fVar13;
      VVar5.x = fVar12;
      b.y = local_108 - fVar16;
      b.x = fVar1 - fVar16;
      VVar5 = Math::Min<Rml::Vector2<float>>(VVar5,b);
      uStack_f0 = extraout_XMM0_Dc;
      local_f8 = (undefined1  [8])VVar5;
      uStack_ec = extraout_XMM0_Dd;
      a.y = fStack_e4;
      a.x = local_e8;
      b_00.y = (float)local_48._0_4_ + local_108;
      b_00.x = fVar1 + (float)local_48._0_4_;
      VVar5 = Math::Max<Rml::Vector2<float>>(a,b_00);
      local_e8 = VVar5.x;
      fStack_e4 = VVar5.y;
      uStack_e0 = extraout_XMM0_Dc_00;
      uStack_dc = extraout_XMM0_Dd_00;
      fVar12 = (float)local_f8._0_4_;
      fVar13 = (float)local_f8._4_4_;
      uVar14 = uStack_f0;
      uVar15 = uStack_ec;
    }
  }
  local_f8._4_4_ = fVar13;
  local_f8._0_4_ = fVar12;
  uStack_f0 = uVar14;
  uStack_ec = uVar15;
  local_128._0_4_ = 0.0;
  local_128._4_4_ = 0.0;
  VStack_120.x = 0.0;
  VStack_120.y = 0.0;
  iVar8 = Element::GetNumBoxes((Element *)render_manager);
  if (0 < iVar8) {
    iVar8 = 0;
    do {
      Element::GetRenderBox((RenderBox *)local_b8,(Element *)render_manager,Border,iVar8);
      local_108 = (float)local_b8._0_8_ + (float)local_b8._8_8_;
      fStack_104 = SUB84(local_b8._0_8_,4) + SUB84(local_b8._8_8_,4);
      uStack_100._0_4_ = 0;
      uStack_100._4_4_ = 0;
      VVar5 = Math::Min<Rml::Vector2<float>>((Vector2f)local_128,(Vector2f)local_b8._8_8_);
      b_01.y = fStack_104;
      b_01.x = local_108;
      VStack_120 = Math::Max<Rml::Vector2<float>>(VStack_120,b_01);
      iVar8 = iVar8 + 1;
      local_128 = (undefined1  [8])VVar5;
      iVar9 = Element::GetNumBoxes((Element *)render_manager);
    } while (iVar8 < iVar9);
  }
  VStack_120.y = fStack_e4 + VStack_120.y;
  local_128._4_4_ = (float)local_f8._4_4_ + (float)local_128._4_4_;
  local_128._0_4_ = (float)local_128._0_4_ + (float)local_f8._0_4_;
  VStack_120.x = VStack_120.x + local_e8;
  Math::ExpandToPixelGrid((Rectanglef *)local_128);
  local_108 = local_128._0_4_;
  fStack_104 = local_128._4_4_;
  uStack_100._0_4_ = 0;
  uStack_100._4_4_ = 0;
  local_e8 = VStack_120.x;
  local_f8._0_4_ = VStack_120.y;
  VVar3 = (Vector2Type)
          (background_border_geometry->
          super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
          ).render_manager;
  SVar6 = (background_border_geometry->
          super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
          ).resource_handle;
  uVar15 = *(undefined4 *)
            &(background_border_geometry->
             super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
             ).field_0xc;
  VVar4 = *(Vector2Type *)(background_border_geometry + 1);
  (background_border_geometry->
  super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  ).render_manager = (RenderManager *)0x0;
  *(undefined8 *)
   &(background_border_geometry->
    super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
    ).resource_handle = 0;
  background_border_geometry[1].
  super_UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
  .render_manager = (RenderManager *)0x0;
  Geometry::Release((Mesh *)local_b8,(Geometry *)this,ClearMesh);
  origin.y = fStack_104;
  origin.x = local_108;
  fVar12 = (float)local_f8._0_4_ - fStack_104;
  VVar10.x = (int)(local_e8 - local_108);
  dimensions.y = (float)(int)fVar12;
  dimensions.x = (float)VVar10.x;
  MeshUtilities::GenerateQuad
            ((Mesh *)local_b8,origin,dimensions,
             (ColourbPremultiplied)(((int)(local_10c * 255.0) & 0xffU) * 0x1010101));
  local_88 = (Vector2Type *)0x0;
  uStack_80._0_4_ = 0.0;
  uStack_80._4_4_ = 0.0;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88 = (Vector2Type *)operator_new(0x48);
  mesh_00 = local_c0;
  VVar10.y = (int)fVar12;
  *local_88 = local_c8;
  local_88[1] = (Vector2Type)render_manager;
  local_88[2].x = local_68._0_4_;
  local_88[2].y = local_68._4_4_;
  local_88[3].x = local_58._0_4_;
  local_88[3].y = local_58._4_4_;
  local_88[4] = VVar10;
  local_88[5] = (Vector2Type)(CONCAT44(fStack_104,local_108) ^ 0x8000000080000000);
  local_88[6] = VVar3;
  local_88[7].x = SVar6;
  local_88[7].y = uVar15;
  local_88[8] = VVar4;
  pcStack_70 = ::std::
               _Function_handler<bool_(const_Rml::CallbackTextureInterface_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBoxShadow.cpp:91:26)>
               ::_M_invoke;
  local_78 = ::std::
             _Function_handler<bool_(const_Rml::CallbackTextureInterface_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mikke89[P]RmlUi/Source/Core/GeometryBoxShadow.cpp:91:26)>
             ::_M_manager;
  RenderManager::MakeCallbackTexture((RenderManager *)local_128,(CallbackTextureFunction *)local_c0)
  ;
  VVar3 = local_d0;
  CallbackTexture::Release((CallbackTexture *)local_d0);
  fVar12 = VStack_120.x;
  auVar7 = local_128;
  local_128._0_4_ = 0.0;
  local_128._4_4_ = 0.0;
  *(undefined1 (*) [8])VVar3 = auVar7;
  VStack_120.x = -NAN;
  ((Vector2Type *)((long)VVar3 + 8))->x = fVar12;
  CallbackTexture::Release((CallbackTexture *)local_128);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,3);
  }
  RenderManager::MakeGeometry((RenderManager *)local_128,mesh_00);
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>::
  ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                    *)this);
  auVar7 = local_128;
  local_128._0_4_ = 0.0;
  local_128._4_4_ = 0.0;
  *(undefined1 (*) [8])this = auVar7;
  fVar12 = VStack_120.x;
  VStack_120.x = -NAN;
  *(float *)(this + 8) = fVar12;
  UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>::
  ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                    *)local_128);
  if (local_a0 != (pointer)0x0) {
    operator_delete(local_a0,(long)local_90 - (long)local_a0);
  }
  if ((Vector2f)local_b8._0_8_ != (Vector2f)0x0) {
    operator_delete((void *)local_b8._0_8_,local_b8._16_8_ - local_b8._0_8_);
  }
  return;
}

Assistant:

void GeometryBoxShadow::Generate(Geometry& out_shadow_geometry, CallbackTexture& out_shadow_texture, RenderManager& render_manager, Element* element,
	Geometry& background_border_geometry, BoxShadowList shadow_list, const CornerSizes border_radius, const float opacity)
{
	// Find the box-shadow texture dimension and offset required to cover all box-shadows and element boxes combined.
	Vector2f element_offset_in_texture;
	Vector2i texture_dimensions;

	// Resolve all lengths to px units.
	for (BoxShadow& shadow : shadow_list)
	{
		shadow.blur_radius = NumericValue(element->ResolveLength(shadow.blur_radius), Unit::PX);
		shadow.spread_distance = NumericValue(element->ResolveLength(shadow.spread_distance), Unit::PX);
		shadow.offset_x = NumericValue(element->ResolveLength(shadow.offset_x), Unit::PX);
		shadow.offset_y = NumericValue(element->ResolveLength(shadow.offset_y), Unit::PX);
	}

	{
		Vector2f extend_min;
		Vector2f extend_max;

		// Extend the render-texture to encompass box-shadow blur and spread.
		for (const BoxShadow& shadow : shadow_list)
		{
			if (!shadow.inset)
			{
				const float extend = 1.5f * shadow.blur_radius.number + shadow.spread_distance.number;
				const Vector2f offset = {shadow.offset_x.number, shadow.offset_y.number};
				extend_min = Math::Min(extend_min, offset - Vector2f(extend));
				extend_max = Math::Max(extend_max, offset + Vector2f(extend));
			}
		}

		Rectanglef texture_region;

		// Extend the render-texture further to cover all the element's boxes.
		for (int i = 0; i < element->GetNumBoxes(); i++)
		{
			const RenderBox box = element->GetRenderBox(BoxArea::Border, i);
			texture_region = texture_region.Join(Rectanglef::FromPositionSize(box.GetBorderOffset(), box.GetFillSize()));
		}

		texture_region = texture_region.Extend(-extend_min, extend_max);
		Math::ExpandToPixelGrid(texture_region);

		element_offset_in_texture = -texture_region.TopLeft();
		texture_dimensions = Vector2i(texture_region.Size());
	}

	// Callback for generating the box-shadow texture. Using a callback ensures that the texture can be regenerated at any time, for example if the
	// device loses its GPU context and the client calls Rml::ReleaseTextures().
	auto texture_callback = [&background_border_geometry, element, border_radius, texture_dimensions, element_offset_in_texture,
								shadow_list = std::move(shadow_list)](const CallbackTextureInterface& texture_interface) -> bool {
		RenderManager& render_manager = texture_interface.GetRenderManager();

		Mesh mesh_padding;        // Render geometry for inner box-shadow.
		Mesh mesh_padding_border; // Clipping mask for outer box-shadow.

		bool has_inner_shadow = false;
		bool has_outer_shadow = false;
		for (const BoxShadow& shadow : shadow_list)
		{
			if (shadow.inset)
				has_inner_shadow = true;
			else
				has_outer_shadow = true;
		}

		// Generate the geometry for all the element's boxes and extend the render-texture further to cover all of them.
		for (int i = 0; i < element->GetNumBoxes(); i++)
		{
			ColourbPremultiplied white(255);
			if (has_inner_shadow)
				MeshUtilities::GenerateBackground(mesh_padding, element->GetRenderBox(BoxArea::Padding, i), white);
			if (has_outer_shadow)
				MeshUtilities::GenerateBackground(mesh_padding_border, element->GetRenderBox(BoxArea::Border, i), white);
		}

		const RenderState initial_render_state = render_manager.GetState();
		render_manager.ResetState();
		render_manager.SetScissorRegion(Rectanglei::FromSize(texture_dimensions));

		// The scissor region will be clamped to the current window size, check the resulting scissor region.
		const Rectanglei scissor_region = render_manager.GetScissorRegion();
		if (scissor_region.Width() <= 0 || scissor_region.Height() <= 0)
		{
			// The window may become zero-sized for example when minimized. Just skip the texture generation for now, we
			// expect to be called again later when the window is restored.
			render_manager.SetState(initial_render_state);
			return false;
		}
		if (scissor_region != Rectanglei::FromSize(texture_dimensions))
		{
			Log::Message(Log::LT_INFO,
				"The desired box-shadow texture dimensions (%d, %d) are larger than the current window region (%d, %d). "
				"Results may be clipped. In element: %s",
				texture_dimensions.x, texture_dimensions.y, scissor_region.Width(), scissor_region.Height(), element->GetAddress().c_str());
		}

		render_manager.PushLayer();

		background_border_geometry.Render(element_offset_in_texture);

		for (int shadow_index = (int)shadow_list.size() - 1; shadow_index >= 0; shadow_index--)
		{
			const BoxShadow& shadow = shadow_list[shadow_index];
			const Vector2f shadow_offset = {shadow.offset_x.number, shadow.offset_y.number};
			const bool inset = shadow.inset;
			const float spread_distance = shadow.spread_distance.number;
			const float blur_radius = shadow.blur_radius.number;

			CornerSizes spread_radii = border_radius;
			for (int i = 0; i < 4; i++)
			{
				float& radius = spread_radii[i];
				float spread_factor = (inset ? -1.f : 1.f);
				if (radius < spread_distance)
				{
					const float ratio_minus_one = (radius / spread_distance) - 1.f;
					spread_factor *= 1.f + ratio_minus_one * ratio_minus_one * ratio_minus_one;
				}
				radius = Math::Max(radius + spread_factor * spread_distance, 0.f);
			}

			Mesh mesh_shadow;

			// Generate the shadow geometry. For outer box-shadows it is rendered normally, while for inset box-shadows it is used as a clipping mask.
			for (int i = 0; i < element->GetNumBoxes(); i++)
			{
				const float signed_spread_distance = (inset ? -spread_distance : spread_distance);
				RenderBox render_box = element->GetRenderBox(inset ? BoxArea::Padding : BoxArea::Border, i);
				render_box.SetFillSize(Math::Max(render_box.GetFillSize() + Vector2f(2.f * signed_spread_distance), Vector2f{0.001f}));
				render_box.SetBorderRadius(spread_radii);
				render_box.SetBorderOffset(render_box.GetBorderOffset() - Vector2f(signed_spread_distance));
				MeshUtilities::GenerateBackground(mesh_shadow, render_box, shadow.color);
			}

			CompiledFilter blur;
			if (blur_radius >= 0.5f)
			{
				blur = render_manager.CompileFilter("blur", Dictionary{{"sigma", Variant(0.5f * blur_radius)}});
				if (blur)
					render_manager.PushLayer();
			}

			Geometry geometry_shadow = render_manager.MakeGeometry(std::move(mesh_shadow));

			if (inset)
			{
				render_manager.SetClipMask(ClipMaskOperation::SetInverse, &geometry_shadow, shadow_offset + element_offset_in_texture);

				for (Rml::Vertex& vertex : mesh_padding.vertices)
					vertex.colour = shadow.color;

				// @performance: Don't need to copy the mesh if this is the last use of it.
				Geometry geometry_padding = render_manager.MakeGeometry(Mesh(mesh_padding));
				geometry_padding.Render(element_offset_in_texture);

				render_manager.SetClipMask(ClipMaskOperation::Set, &geometry_padding, element_offset_in_texture);
			}
			else
			{
				Mesh mesh = mesh_padding_border;
				Geometry geometry_padding_border = render_manager.MakeGeometry(std::move(mesh));
				render_manager.SetClipMask(ClipMaskOperation::SetInverse, &geometry_padding_border, element_offset_in_texture);
				geometry_shadow.Render(shadow_offset + element_offset_in_texture);
			}

			if (blur)
			{
				FilterHandleList filters;
				blur.AddHandleTo(filters);
				render_manager.CompositeLayers(render_manager.GetTopLayer(), render_manager.GetNextLayer(), BlendMode::Blend, filters);
				render_manager.PopLayer();
				blur.Release();
			}
		}

		texture_interface.SaveLayerAsTexture();

		render_manager.PopLayer();
		render_manager.SetState(initial_render_state);

		return true;
	};

	Mesh mesh = out_shadow_geometry.Release(Geometry::ReleaseMode::ClearMesh);
	const byte alpha = byte(opacity * 255.f);
	MeshUtilities::GenerateQuad(mesh, -element_offset_in_texture, Vector2f(texture_dimensions), ColourbPremultiplied(alpha, alpha));

	out_shadow_texture = render_manager.MakeCallbackTexture(std::move(texture_callback));
	out_shadow_geometry = render_manager.MakeGeometry(std::move(mesh));
}